

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O3

Utest * __thiscall
TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_TestShell::createTest
          (TEST_ScoringTableTest_DealerWinByDiscard_ManganOrMore_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                                  ,0x82);
  this_00->_vptr_Utest = (_func_int **)0x0;
  *(undefined1 *)&this_00[1]._vptr_Utest = 0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_001dd5b0;
  return this_00;
}

Assistant:

TEST(ScoringTableTest, DealerWinByDiscard_ManganOrMore)
{
	CHECK_EQUAL(12000, t.dealerWinByDiscard(3, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 40));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(4, 70));
	CHECK_EQUAL(12000, t.dealerWinByDiscard(5, 0));

	CHECK_EQUAL(18000, t.dealerWinByDiscard(6, 0));
	CHECK_EQUAL(18000, t.dealerWinByDiscard(7, 0));

	CHECK_EQUAL(24000, t.dealerWinByDiscard(8, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(9, 0));
	CHECK_EQUAL(24000, t.dealerWinByDiscard(10, 0));

	CHECK_EQUAL(36000, t.dealerWinByDiscard(11, 0));
	CHECK_EQUAL(36000, t.dealerWinByDiscard(12, 0));

	CHECK_EQUAL(48000, t.dealerWinByDiscard(13, 0));
}